

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::correctOutput(HlslParseContext *this,TQualifier *qualifier)

{
  TIntermediate *pTVar1;
  bool bVar2;
  EShLanguage EVar3;
  uint uVar4;
  ulong uVar5;
  
  TQualifier::clearUniformLayout(qualifier);
  qualifier->layoutPushConstant = false;
  EVar3 = (this->super_TParseContextBase).super_TParseVersions.language;
  if (EVar3 == EShLangFragment) {
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffc01f1fffffff;
    EVar3 = (this->super_TParseContextBase).super_TParseVersions.language;
  }
  if (EVar3 == EShLangGeometry) {
LAB_0039a5e5:
    uVar5 = *(ulong *)&qualifier->field_0x8 & 0xffffefffffffffff;
    *(ulong *)&qualifier->field_0x8 = uVar5;
  }
  else {
    qualifier->field_0x23 = 0xff;
    EVar3 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EVar3 == EShLangFragment) {
      *(uint *)&qualifier->field_0x24 = *(uint *)&qualifier->field_0x24 | 0x7fffffff;
      EVar3 = (this->super_TParseContextBase).super_TParseVersions.language;
    }
    if (EVar3 != EShLangTessControl) goto LAB_0039a5e5;
    uVar5 = *(ulong *)&qualifier->field_0x8;
  }
  if ((uVar5 & 0xff80) == 0) {
    uVar5 = uVar5 | (uint)(uVar5 >> 9) & 0xff80;
    *(ulong *)&qualifier->field_0x8 = uVar5;
  }
  uVar4 = (uint)(uVar5 >> 7) & 0x1ff;
  if (uVar4 == 0x92) {
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar1->depthReplacing = true;
    if (pTVar1->depthLayout == EldNone) {
      pTVar1->depthLayout = EldLess;
    }
  }
  else {
    if (uVar4 != 0x91) {
      if (uVar4 == 0x43) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar1->depthReplacing = true;
        if (pTVar1->depthLayout == EldNone) {
          pTVar1->depthLayout = EldAny;
        }
      }
      goto LAB_0039a69d;
    }
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar1->depthReplacing = true;
    if (pTVar1->depthLayout == EldNone) {
      pTVar1->depthLayout = EldGreater;
    }
  }
  *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffff007f | 0x2180;
LAB_0039a69d:
  bVar2 = isOutputBuiltIn(this,qualifier);
  if (!bVar2) {
    *(ushort *)&qualifier->field_0x8 = *(ushort *)&qualifier->field_0x8 & 0x7f;
  }
  return;
}

Assistant:

void HlslParseContext::correctOutput(TQualifier& qualifier)
{
    clearUniform(qualifier);
    if (language == EShLangFragment)
        qualifier.clearInterstage();
    if (language != EShLangGeometry)
        qualifier.clearStreamLayout();
    if (language == EShLangFragment)
        qualifier.clearXfbLayout();
    if (language != EShLangTessControl)
        qualifier.patch = false;

    // Fixes Test/hlsl.entry-inout.vert (SV_Position will not become a varying).
    if (qualifier.builtIn == EbvNone)
        qualifier.builtIn = qualifier.declaredBuiltIn;

    switch (qualifier.builtIn) {
    case EbvFragDepth:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldAny);
        break;
    case EbvFragDepthGreater:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldGreater);
        qualifier.builtIn = EbvFragDepth;
        break;
    case EbvFragDepthLesser:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldLess);
        qualifier.builtIn = EbvFragDepth;
        break;
    default:
        break;
    }

    if (! isOutputBuiltIn(qualifier))
        qualifier.builtIn = EbvNone;
}